

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

uint llvm::dwarf::FormVendor(Form Form)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,Form);
  if ((((iVar2 == 0x1f21) || (iVar2 == 0x1f02)) || (iVar2 == 0x1f20)) ||
     (uVar1 = 0, iVar2 == 0x1f01)) {
    uVar1 = 3;
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::FormVendor(dwarf::Form Form) {
  switch (Form) {
  default:
    return 0;
#define HANDLE_DW_FORM(ID, NAME, VERSION, VENDOR)                              \
  case DW_FORM_##NAME:                                                         \
    return DWARF_VENDOR_##VENDOR;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}